

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucptrie.cpp
# Opt level: O1

int32_t ucptrie_internalU8PrevIndex_63(UCPTrie *trie,UChar32 c,uint8_t *start,uint8_t *src)

{
  uint c_00;
  int iVar1;
  uint uVar2;
  long lVar3;
  int32_t i;
  uint local_1c;
  
  lVar3 = (long)src - (long)start;
  if (lVar3 < 8) {
    local_1c = (uint)lVar3;
  }
  else {
    local_1c = 7;
    start = src + -7;
    lVar3 = 7;
  }
  c_00 = utf8_prevCharSafeBody_63(start,0,(int32_t *)&local_1c,c,-1);
  uVar2 = (int)lVar3 - local_1c;
  if (c_00 < 0x10000) {
    iVar1 = (c_00 & 0x3f) + (uint)trie->index[c_00 >> 6];
  }
  else if (c_00 < 0x110000) {
    if ((int)c_00 < trie->highStart) {
      local_1c = uVar2;
      iVar1 = ucptrie_internalSmallIndex_63(trie,c_00);
    }
    else {
      iVar1 = trie->dataLength + -2;
    }
  }
  else {
    iVar1 = trie->dataLength + -1;
  }
  return iVar1 << 3 | uVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucptrie_internalU8PrevIndex(const UCPTrie *trie, UChar32 c,
                            const uint8_t *start, const uint8_t *src) {
    int32_t i, length;
    // Support 64-bit pointers by avoiding cast of arbitrary difference.
    if ((src - start) <= 7) {
        i = length = (int32_t)(src - start);
    } else {
        i = length = 7;
        start = src - 7;
    }
    c = utf8_prevCharSafeBody(start, 0, &i, c, -1);
    i = length - i;  // Number of bytes read backward from src.
    int32_t idx = _UCPTRIE_CP_INDEX(trie, 0xffff, c);
    return (idx << 3) | i;
}